

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

string * __thiscall
choc::html::HTMLElement::escapeHTMLString_abi_cxx11_
          (string *__return_storage_ptr__,HTMLElement *this,string_view text,bool escapeNewLines)

{
  char cVar1;
  bool bVar2;
  HTMLElement *pHVar3;
  char local_94;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pHVar3 = (HTMLElement *)0x0;
  do {
    if (this == pHVar3) {
      return __return_storage_ptr__;
    }
    cVar1 = *(char *)((long)&(pHVar3->name)._M_dataplus._M_p + text._M_len);
    bVar2 = isCharLegal((int)cVar1);
    if (bVar2) {
LAB_0028f6cc:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else if ((((cVar1 == '\"') || (cVar1 == '&')) || (cVar1 == '<')) || (cVar1 == '>')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      local_94 = (char)text._M_str;
      if ((local_94 == '\0') && ((cVar1 == '\r' || (cVar1 == '\n')))) goto LAB_0028f6cc;
      std::__cxx11::to_string(&local_90,(int)cVar1);
      std::operator+(&local_70,"&#",&local_90);
      std::operator+(&local_50,&local_70,';');
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    pHVar3 = (HTMLElement *)((long)&(pHVar3->name)._M_dataplus._M_p + 1);
  } while( true );
}

Assistant:

static std::string escapeHTMLString (std::string_view text, bool escapeNewLines)
    {
        std::string result;

        for (auto character : text)
        {
            auto unicodeChar = static_cast<uint32_t> (character);

            if (isCharLegal (unicodeChar))
            {
                result += character;
            }
            else
            {
                switch (unicodeChar)
                {
                    case '<':   result += "&lt;";   break;
                    case '>':   result += "&gt;";   break;
                    case '&':   result += "&amp;";  break;
                    case '"':   result += "&quot;"; break;

                    default:
                        if (! escapeNewLines && (unicodeChar == '\n' || unicodeChar == '\r'))
                            result += character;
                        else
                            result += "&#" + std::to_string (unicodeChar) + ';';

                        break;
                }
            }
        }

        return result;
    }